

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

void __thiscall
TTD::SlabAllocatorBase<0>::ComputeMemoryUsed
          (SlabAllocatorBase<0> *this,uint64 *usedSpace,uint64 *reservedSpace)

{
  LargeSlabBlock *local_38;
  LargeSlabBlock *currLargeBlock;
  SlabBlock *currBlock;
  uint64 memreserved;
  uint64 *reservedSpace_local;
  uint64 *usedSpace_local;
  SlabAllocatorBase<0> *this_local;
  
  currBlock = (SlabBlock *)0x0;
  for (currLargeBlock = (LargeSlabBlock *)this->m_headBlock; currLargeBlock != (LargeSlabBlock *)0x0
      ; currLargeBlock = *(LargeSlabBlock **)&currLargeBlock->TotalBlockSize) {
    currBlock = (SlabBlock *)((long)&currBlock->BlockData + (ulong)this->m_slabBlockSize);
  }
  for (local_38 = this->m_largeBlockList; local_38 != (LargeSlabBlock *)0x0;
      local_38 = local_38->Previous) {
    currBlock = (SlabBlock *)((long)&currBlock->BlockData + (ulong)local_38->TotalBlockSize);
  }
  *usedSpace = this->m_totalAllocatedSize;
  *reservedSpace = (uint64)currBlock;
  return;
}

Assistant:

void ComputeMemoryUsed(uint64* usedSpace, uint64* reservedSpace) const
        {
            uint64 memreserved = 0;

            for (SlabBlock* currBlock = this->m_headBlock; currBlock != nullptr; currBlock = currBlock->Previous)
            {
                memreserved += (uint64)this->m_slabBlockSize;
            }

            for (LargeSlabBlock* currLargeBlock = this->m_largeBlockList; currLargeBlock != nullptr; currLargeBlock = currLargeBlock->Previous)
            {
                memreserved += (uint64)(currLargeBlock->TotalBlockSize);
            }

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
            *usedSpace = this->m_totalAllocatedSize;
#else
            *usedSpace = 0;
#endif

            *reservedSpace = memreserved;
        }